

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_default_dic_path(OpenJTalk *oj)

{
  _Bool _Var1;
  char *wildcard;
  char **ppcVar2;
  char temp [260];
  char acStack_138 [272];
  
  if (oj != (OpenJTalk *)0x0) {
    memset(acStack_138,0,0x104);
    if (G_DEFAULT_DIC_DIR_NAMES[0] == (char *)0x0 || g_data_install_path[0] == '\0') {
      return false;
    }
    ppcVar2 = G_DEFAULT_DIC_DIR_NAMES;
    wildcard = G_DEFAULT_DIC_DIR_NAMES[0];
    do {
      ppcVar2 = ppcVar2 + 1;
      _Var1 = search_directory_or_file(g_data_install_path,wildcard,true,acStack_138);
      if (_Var1) {
        _Var1 = check_dic_utf_8(acStack_138);
        if (!_Var1) {
          return false;
        }
        strcpy(oj->dn_dic_path,acStack_138);
        Open_JTalk_load_dic(oj->open_jtalk,acStack_138);
        return true;
      }
      wildcard = *ppcVar2;
    } while (wildcard != (char *)0x0);
  }
  return false;
}

Assistant:

bool set_default_dic_path(OpenJTalk *oj)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 標準のインストールフォルダから可能性のある名前を探す。
	if (g_data_install_path != NULL && strlen(g_data_install_path) != 0)
	{
		for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(g_data_install_path, *d, temp))
			{
				goto check_charset;
			}
		}
	}
	return false;

check_charset:
	if (!check_dic_utf_8(temp))
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif
	return true;
}